

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_python.cpp
# Opt level: O0

void __thiscall
flatbuffers::python::PythonGenerator::GenVectorInit
          (PythonGenerator *this,FieldDef *field,string *field_type_ptr,
          set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *import_list,
          set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *import_typing_list)

{
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_00;
  pair<std::_Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool>
  pVar1;
  string local_220;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_200;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c0;
  _Base_ptr local_1a0;
  undefined1 local_198;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_190;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_170;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_150;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_130;
  undefined1 local_110 [8];
  string package_reference;
  undefined1 local_d0 [8];
  string object_type;
  BaseType local_a8;
  BaseType base_type;
  StructDef *local_a0;
  Type *local_88;
  Type *vector_type;
  string *field_type;
  undefined1 local_70;
  allocator<char> local_51;
  value_type local_50;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_30;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *import_typing_list_local;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *import_list_local;
  string *field_type_ptr_local;
  FieldDef *field_local;
  PythonGenerator *this_local;
  
  local_30 = import_typing_list;
  import_typing_list_local = import_list;
  import_list_local =
       (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        *)field_type_ptr;
  field_type_ptr_local = (string *)field;
  field_local = (FieldDef *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,"List",&local_51);
  pVar1 = std::
          set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::insert(import_typing_list,&local_50);
  field_type = (string *)pVar1.first._M_node;
  local_70 = pVar1.second;
  std::__cxx11::string::~string((string *)&local_50);
  std::allocator<char>::~allocator(&local_51);
  vector_type = (Type *)import_list_local;
  Type::VectorType((Type *)&stack0xffffffffffffff58,
                   (Type *)&field_type_ptr_local[6]._M_string_length);
  local_88 = (Type *)&stack0xffffffffffffff58;
  if (local_a8 == BASE_TYPE_STRUCT) {
    IdlNamer::ObjectType_abi_cxx11_((string *)local_d0,&this->namer_,local_a0);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)&package_reference.field_2 + 8),(string *)local_d0,"]");
    std::__cxx11::string::operator=
              ((string *)vector_type,(string *)(package_reference.field_2._M_local_buf + 8));
    std::__cxx11::string::~string((string *)(package_reference.field_2._M_local_buf + 8));
    if (((((this->super_BaseGenerator).parser_)->opts).include_dependence_headers & 1U) != 0) {
      GenPackageReference_abi_cxx11_((string *)local_110,this,local_88);
      std::operator+(&local_170,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_110,
                     ".");
      std::operator+(&local_150,&local_170,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_d0);
      std::operator+(&local_130,&local_150,"]");
      std::__cxx11::string::operator=((string *)vector_type,(string *)&local_130);
      std::__cxx11::string::~string((string *)&local_130);
      std::__cxx11::string::~string((string *)&local_150);
      std::__cxx11::string::~string((string *)&local_170);
      this_00 = import_typing_list_local;
      std::operator+(&local_190,"import ",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_110)
      ;
      pVar1 = std::
              set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::insert(this_00,&local_190);
      local_1a0 = (_Base_ptr)pVar1.first._M_node;
      local_198 = pVar1.second;
      std::__cxx11::string::~string((string *)&local_190);
      std::__cxx11::string::~string((string *)local_110);
    }
    std::operator+(&local_1c0,"List[",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)vector_type)
    ;
    std::__cxx11::string::operator=((string *)vector_type,(string *)&local_1c0);
    std::__cxx11::string::~string((string *)&local_1c0);
    std::__cxx11::string::~string((string *)local_d0);
  }
  else {
    GetBasePythonTypeForScalarAndString_abi_cxx11_
              (&local_220,this,(BaseType *)(object_type.field_2._M_local_buf + 0xc));
    std::operator+(&local_200,"List[",&local_220);
    std::operator+(&local_1e0,&local_200,"]");
    std::__cxx11::string::operator=((string *)vector_type,(string *)&local_1e0);
    std::__cxx11::string::~string((string *)&local_1e0);
    std::__cxx11::string::~string((string *)&local_200);
    std::__cxx11::string::~string((string *)&local_220);
  }
  return;
}

Assistant:

void GenVectorInit(const FieldDef &field, std::string *field_type_ptr,
                     std::set<std::string> *import_list,
                     std::set<std::string> *import_typing_list) const {
    import_typing_list->insert("List");
    auto &field_type = *field_type_ptr;
    const Type &vector_type = field.value.type.VectorType();
    const BaseType base_type = vector_type.base_type;
    if (base_type == BASE_TYPE_STRUCT) {
      const std::string object_type =
          namer_.ObjectType(*vector_type.struct_def);
      field_type = object_type + "]";
      if (parser_.opts.include_dependence_headers) {
        auto package_reference = GenPackageReference(vector_type);
        field_type = package_reference + "." + object_type + "]";
        import_list->insert("import " + package_reference);
      }
      field_type = "List[" + field_type;
    } else {
      field_type =
          "List[" + GetBasePythonTypeForScalarAndString(base_type) + "]";
    }
  }